

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O0

Vec_Int_t * Vec_WecPushLevel(Vec_Wec_t *p)

{
  Vec_Int_t *pVVar1;
  Vec_Wec_t *p_local;
  
  if (p->nSize == p->nCap) {
    if (p->nCap < 0x10) {
      Vec_WecGrow(p,0x10);
    }
    else {
      Vec_WecGrow(p,p->nCap << 1);
    }
  }
  p->nSize = p->nSize + 1;
  pVVar1 = Vec_WecEntryLast(p);
  return pVVar1;
}

Assistant:

static inline Vec_Int_t * Vec_WecPushLevel( Vec_Wec_t * p )
{
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_WecGrow( p, 16 );
        else
            Vec_WecGrow( p, 2 * p->nCap );
    }
    ++p->nSize;
    return Vec_WecEntryLast( p );
}